

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lights.cpp
# Opt level: O2

float pbrt::cie_y(float lambda)

{
  float fVar1;
  float fVar2;
  
  fVar2 = (lambda + -568.8) * *(float *)(&DAT_00143648 + (ulong)(lambda < 568.8) * 4);
  fVar1 = (lambda + -530.9) * *(float *)(&DAT_00143650 + (ulong)(lambda < 530.9) * 4);
  fVar2 = expf(fVar2 * -0.5 * fVar2);
  fVar1 = expf(fVar1 * -0.5 * fVar1);
  return fVar1 * 0.286 + fVar2 * 0.821;
}

Assistant:

inline float cie_y(float lambda)
  {
      float t1 = (lambda - 568.8f) * ((lambda < 568.8f) ? 0.0213f : 0.0247f);
      float t2 = (lambda - 530.9f) * ((lambda < 530.9f) ? 0.0613f : 0.0322f);
  
      return 0.821f * std::exp(-0.5f * t1 * t1) + 0.286f * std::exp(-0.5f * t2 * t2);
  }